

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visit.hpp
# Opt level: O1

void mserialize::detail::
     visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
               (string_view full_tag,string_view tag,CountingVisitor *visitor,
               basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *istream,
               int max_recursion)

{
  detail __rhs;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  detail *pdVar5;
  detail *pdVar6;
  detail *pdVar7;
  long *plVar8;
  runtime_error *prVar9;
  ulong uVar10;
  char *pcVar11;
  size_type *psVar12;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  detail *pdVar13;
  long lVar14;
  detail *pdVar15;
  detail *in_R10;
  detail *pdVar16;
  int iVar17;
  detail *pdVar18;
  detail *pdVar19;
  char *pcVar20;
  string_view full_tag_00;
  string_view full_tag_01;
  string_view full_tag_02;
  string_view full_tag_03;
  string_view full_tag_04;
  string_view full_tag_05;
  string_view tag_00;
  string_view tag_01;
  string_view tag_02;
  string_view tag_03;
  string_view tag_04;
  string_view tag_05;
  string_view tags;
  string_view tags_00;
  string_view tags_01;
  string_view tags_02;
  string_view tags_03;
  string_view tags_04;
  uint8_t discriminator;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  detail *local_80;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  size_t extraout_RDX_02;
  detail *extraout_RDX_03;
  
  uVar10 = tag._len;
  tags_02._len = (detail *)tag._ptr;
  full_tag_00._len = (detail *)full_tag._len;
  pdVar7 = (detail *)full_tag._ptr;
  if (max_recursion == 0) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pdVar7,full_tag_00._len + (long)pdVar7);
    std::operator+(&local_a8,"Recursion limit exceeded while visiting tag: ",&local_70);
    std::runtime_error::runtime_error(prVar9,(string *)&local_a8);
    __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (uVar10 == 0) {
    return;
  }
  __rhs = *tags_02._len;
  pdVar18 = (detail *)(ulong)(byte)__rhs;
  local_80 = pdVar7;
  if ((byte)__rhs < 0x3c) {
    if (__rhs == (detail)0x28) {
      pdVar7 = tags_02._len + 1;
      pcVar20 = (char *)0x0;
      if (uVar10 != 1) {
        pcVar20 = (char *)(uVar10 - 2);
      }
      visitor->_count = visitor->_count + 1;
      tags_02._ptr = pcVar20;
      pcVar4 = (char *)tag_first_size(pdVar7,tags_02);
      pdVar18 = local_80;
      if (pcVar4 != (char *)0x0) {
        pcVar11 = pcVar4;
        if (pcVar20 < pcVar4) {
          pcVar11 = pcVar20;
        }
        pcVar20 = pcVar20 + -(long)pcVar11;
        pdVar19 = (detail *)(pcVar11 + (long)pdVar7);
        do {
          pdVar6 = pdVar19;
          full_tag_03._len = (size_t)full_tag_00._len;
          full_tag_03._ptr = (char *)pdVar18;
          tag_03._len = (size_t)pcVar4;
          tag_03._ptr = (char *)pdVar7;
          visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                    (full_tag_03,tag_03,visitor,istream,max_recursion + -1);
          tags_03._len = extraout_RDX_02;
          tags_03._ptr = pcVar20;
          pcVar4 = (char *)tag_first_size(pdVar6,tags_03);
          pcVar11 = pcVar4;
          if (pcVar20 < pcVar4) {
            pcVar11 = pcVar20;
          }
          pcVar20 = pcVar20 + -(long)pcVar11;
          pdVar19 = pdVar6 + (long)pcVar11;
          pdVar7 = pdVar6;
        } while (pcVar4 != (char *)0x0);
      }
      goto LAB_001467bc;
    }
    if (__rhs == (detail)0x2f) {
      pdVar7 = tags_02._len + 1;
      if (uVar10 < 3) {
        lVar14 = 0;
        if (uVar10 != 1) {
          lVar14 = uVar10 - 2;
        }
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pdVar7,pdVar7 + lVar14);
        std::operator+(&local_70,"Invalid enum tag: \'",&local_50);
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_a8._M_dataplus._M_p = (pointer)*plVar8;
        psVar12 = (size_type *)(plVar8 + 2);
        if ((size_type *)local_a8._M_dataplus._M_p == psVar12) {
          local_a8.field_2._M_allocated_capacity = *psVar12;
          local_a8.field_2._8_8_ = plVar8[3];
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar12;
        }
        local_a8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::runtime_error::runtime_error(prVar9,(string *)&local_a8);
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_a8.field_2._8_8_ = local_a8.field_2._M_local_buf + 3;
      visit_arithmetic<mserialize::detail::IntegerToHex,std::__cxx11::stringstream>
                ((char)*pdVar7,(IntegerToHex *)&local_a8,istream);
      *(char *)(local_a8.field_2._8_8_ + -1) = '\'';
      goto LAB_001467bc;
    }
  }
  else {
    if (__rhs == (detail)0x3c) {
      pdVar7 = tags_02._len + 1;
      pcVar20 = (char *)0x0;
      if (uVar10 != 1) {
        pcVar20 = (char *)(uVar10 - 2);
      }
      std::istream::read((char *)istream,(long)&local_a8);
      sVar3 = extraout_RDX_00;
      for (; (char)local_a8._M_dataplus._M_p != '\0';
          local_a8._M_dataplus._M_p._0_1_ = (char)local_a8._M_dataplus._M_p + -1) {
        tags_00._len = sVar3;
        tags_00._ptr = pcVar20;
        pcVar4 = (char *)tag_first_size(pdVar7,tags_00);
        if (pcVar20 < pcVar4) {
          pcVar4 = pcVar20;
        }
        pdVar7 = pdVar7 + (long)pcVar4;
        pcVar20 = pcVar20 + -(long)pcVar4;
        sVar3 = extraout_RDX_01;
      }
      tags_01._len = sVar3;
      tags_01._ptr = pcVar20;
      sVar3 = tag_first_size(pdVar7,tags_01);
      iVar17 = visitor->_count;
      visitor->_count = iVar17 + 1;
      if ((sVar3 == 1) && (iVar2 = bcmp(pdVar7,"0",1), iVar2 == 0)) {
        visitor->_count = iVar17 + 2;
      }
      else {
        full_tag_02._len = (size_t)full_tag_00._len;
        full_tag_02._ptr = (char *)local_80;
        tag_02._len = sVar3;
        tag_02._ptr = (char *)pdVar7;
        visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                  (full_tag_02,tag_02,visitor,istream,max_recursion + -1);
      }
      goto LAB_001467bc;
    }
    if (__rhs == (detail)0x7b) {
      pdVar19 = (detail *)(uVar10 - 1);
      if (uVar10 == 0) {
        pdVar19 = (detail *)0x0;
      }
      pdVar6 = (detail *)0x0;
      if ((detail *)(uVar10 - 1) != (detail *)0x0) {
        pdVar5 = (detail *)0x0;
        do {
          pdVar6 = pdVar5;
          if (tags_02._len[(long)pdVar5] == (detail)0x60) break;
          pdVar5 = pdVar5 + 1;
          pdVar6 = pdVar19;
        } while (pdVar19 != pdVar5);
      }
      pdVar5 = pdVar6;
      if (pdVar19 < pdVar6) {
        pdVar5 = pdVar19;
      }
      pdVar19 = pdVar19 + -(long)pdVar5;
      pdVar13 = tags_02._len;
      if (pdVar19 == (detail *)0x0) {
        pdVar5 = full_tag_00._len;
        if (pdVar6 != (detail *)0x0) {
          do {
            pdVar13 = pdVar5;
            if (pdVar13 == (detail *)0x0) goto LAB_001466cd;
            pdVar5 = pdVar13;
            pdVar15 = pdVar7;
            do {
              pdVar16 = (detail *)0x0;
              do {
                if (pdVar5 == pdVar16) {
                  bVar1 = false;
                  in_R10 = pdVar7 + (long)pdVar13;
                  goto LAB_00146604;
                }
                if (pdVar15[(long)pdVar16] != tags_02._len[(long)pdVar16]) {
                  bVar1 = true;
                  goto LAB_00146604;
                }
                pdVar16 = pdVar16 + 1;
              } while (pdVar6 != pdVar16);
              bVar1 = false;
              in_R10 = pdVar15;
LAB_00146604:
              pdVar15 = pdVar15 + 1;
              pdVar5 = pdVar5 + -1;
            } while (bVar1);
            pdVar5 = in_R10 + -(long)pdVar7;
            if (in_R10 == pdVar7 + (long)pdVar13) {
              pdVar5 = (detail *)0xffffffffffffffff;
            }
            if (pdVar13 < pdVar5) {
              pdVar5 = pdVar13;
            }
            pdVar13 = pdVar13 + -(long)pdVar5;
            pdVar15 = pdVar6;
            if (pdVar13 < pdVar6) {
              pdVar15 = pdVar13;
            }
            pdVar7 = pdVar7 + (long)pdVar5 + (long)pdVar15;
            iVar17 = 3;
            pdVar13 = pdVar13 + -(long)pdVar15;
            if ((pdVar13 != (detail *)0x0) && (*pdVar7 != (detail)0x7d)) {
              if (*pdVar7 == (detail)0x60) {
                iVar17 = 1;
                pdVar18 = pdVar7;
                if (pdVar13 == (detail *)0x1) {
                  pdVar19 = (detail *)0x0;
                }
                else {
                  pdVar19 = (detail *)0x1;
                  lVar14 = 1;
                  do {
                    if (pdVar7[(long)pdVar19] == (detail)0x7d) {
                      lVar14 = lVar14 + -1;
                      if (lVar14 == 0) goto LAB_0014669a;
                    }
                    else if (pdVar7[(long)pdVar19] == (detail)0x7b) {
                      lVar14 = lVar14 + 1;
                    }
                    pdVar19 = pdVar19 + 1;
                  } while (pdVar13 != pdVar19);
                  pdVar19 = pdVar13 + -1;
                }
              }
              else {
                iVar17 = 0;
              }
            }
LAB_0014669a:
            pdVar5 = pdVar13;
          } while (iVar17 == 0);
          if (iVar17 == 1) goto LAB_001466d3;
        }
LAB_001466cd:
        pdVar18 = (detail *)0x0;
        pdVar19 = (detail *)0x0;
      }
      else {
        pdVar18 = tags_02._len + (long)pdVar5;
      }
LAB_001466d3:
      visitor->_count = visitor->_count + 1;
      if (pdVar19 != (detail *)0x0) {
        local_74 = max_recursion + -1;
        do {
          pdVar19 = pdVar19 + -1;
          if (pdVar19 == (detail *)0x0) {
            pdVar7 = (detail *)0x1;
          }
          else {
            pdVar6 = (detail *)0x0;
            do {
              pdVar7 = pdVar6;
              if ((pdVar18 + 1)[(long)pdVar6] == (detail)0x27) break;
              pdVar6 = pdVar6 + 1;
              pdVar7 = pdVar19;
            } while (pdVar19 != pdVar6);
            pdVar7 = pdVar7 + 1;
          }
          if (pdVar19 < pdVar7) {
            pdVar7 = pdVar19;
          }
          pdVar5 = pdVar18 + 1 + (long)pdVar7;
          pdVar19 = pdVar19 + -(long)pdVar7;
          tags_04._len = (size_t)pdVar13;
          tags_04._ptr = (char *)pdVar19;
          pdVar6 = (detail *)tag_first_size(pdVar5,tags_04);
          pdVar7 = pdVar6;
          if (pdVar19 < pdVar6) {
            pdVar7 = pdVar19;
          }
          pdVar18 = pdVar5 + (long)pdVar7;
          visitor->_count = visitor->_count + 1;
          full_tag_05._len = (size_t)full_tag_00._len;
          full_tag_05._ptr = (char *)local_80;
          tag_05._len = (size_t)pdVar6;
          tag_05._ptr = (char *)pdVar5;
          visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                    (full_tag_05,tag_05,visitor,istream,local_74);
          visitor->_count = visitor->_count + 1;
          pdVar19 = pdVar19 + -(long)pdVar7;
          pdVar13 = extraout_RDX_03;
        } while (pdVar19 != (detail *)0x0);
      }
      visitor->_count = visitor->_count + 1;
      return;
    }
    if (__rhs == (detail)0x5b) {
      iVar17 = max_recursion + -1;
      pdVar18 = tags_02._len + 1;
      std::istream::read((char *)istream,(long)&local_a8);
      tags._len = extraout_RDX;
      tags._ptr = (char *)(uVar10 - 1);
      sVar3 = tag_first_size(pdVar18,tags);
      pdVar7 = local_80;
      visitor->_count = visitor->_count + 1;
      if (((uint)local_a8._M_dataplus._M_p < 0x21) ||
         (full_tag_00._ptr = (char *)local_80, tag_00._len = sVar3, tag_00._ptr = (char *)pdVar18,
         bVar1 = singular_impl(full_tag_00,tag_00,iVar17), !bVar1)) {
        while ((uint)local_a8._M_dataplus._M_p != 0) {
          local_a8._M_dataplus._M_p._0_4_ = (uint)local_a8._M_dataplus._M_p + -1;
          full_tag_04._len = (size_t)full_tag_00._len;
          full_tag_04._ptr = (char *)pdVar7;
          tag_04._len = sVar3;
          tag_04._ptr = (char *)pdVar18;
          visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                    (full_tag_04,tag_04,visitor,istream,iVar17);
        }
      }
      else {
        visitor->_count = visitor->_count + 1;
        full_tag_01._len = (size_t)full_tag_00._len;
        full_tag_01._ptr = (char *)pdVar7;
        tag_01._len = sVar3;
        tag_01._ptr = (char *)pdVar18;
        visit_impl<(anonymous_namespace)::CountingVisitor,std::__cxx11::stringstream>
                  (full_tag_01,tag_01,visitor,istream,iVar17);
        visitor->_count = visitor->_count + 1;
      }
      goto LAB_001467bc;
    }
  }
  if ((byte)__rhs < 0x62) {
    if ((byte)__rhs < 0x49) {
      if (__rhs == (detail)0x42) goto switchD_00146546_caseD_62;
      if (__rhs != (detail)0x44) goto switchD_00146546_caseD_65;
    }
    else {
      if (__rhs == (detail)0x49) goto switchD_00146546_caseD_66;
      if (__rhs == (detail)0x4c) goto switchD_00146546_caseD_64;
      if (__rhs != (detail)0x53) goto switchD_00146546_caseD_65;
    }
  }
  else {
    switch(__rhs) {
    case (detail)0x62:
    case (detail)0x63:
switchD_00146546_caseD_62:
      break;
    case (detail)0x64:
    case (detail)0x6c:
switchD_00146546_caseD_64:
      break;
    case (detail)0x65:
    case (detail)0x67:
    case (detail)0x68:
    case (detail)0x6a:
    case (detail)0x6b:
switchD_00146546_caseD_65:
      prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"Invalid arithmetic tag: ","");
      std::operator+(&local_a8,&local_70,(char)__rhs);
      std::runtime_error::runtime_error(prVar9,(string *)&local_a8);
      __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    case (detail)0x66:
    case (detail)0x69:
switchD_00146546_caseD_66:
      break;
    default:
      if (__rhs != (detail)0x73) {
        if (__rhs != (detail)0x79) goto switchD_00146546_caseD_65;
        goto switchD_00146546_caseD_62;
      }
    }
  }
  std::istream::read((char *)istream,(long)&local_a8);
LAB_001467bc:
  visitor->_count = visitor->_count + 1;
  return;
}

Assistant:

void visit_impl(const string_view full_tag, string_view tag, Visitor& visitor, InputStream& istream, int max_recursion)
{
  if (max_recursion == 0) { throw std::runtime_error("Recursion limit exceeded while visiting tag: " + full_tag.to_string()); }

  if (tag.empty()) { return; }

  switch (tag.front())
  {
  case '[':
    visit_sequence(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '(':
    visit_tuple(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '<':
    visit_variant(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '{':
    visit_struct(full_tag, tag, visitor, istream, max_recursion - 1);
    break;
  case '/':
    visit_enum(tag, visitor, istream);
    break;
  default:
    visit_arithmetic(tag.front(), visitor, istream);
  }
}